

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

int __thiscall SAT::getLazyVar(SAT *this,ChannelInfo ci)

{
  uint uVar1;
  uint *puVar2;
  ChannelInfo *pCVar3;
  double *pdVar4;
  bool *pbVar5;
  LitFlags *pLVar6;
  ChannelInfo in_RSI;
  long in_RDI;
  int v;
  int in_stack_00000094;
  SAT *in_stack_00000098;
  ChannelInfo in_stack_000000a0;
  uint in_stack_ffffffffffffffd8;
  LitFlags local_18;
  uint local_14;
  ChannelInfo local_8;
  
  local_8 = in_RSI;
  uVar1 = vec<int>::size((vec<int> *)(in_RDI + 0xa0));
  if (uVar1 == 0) {
    local_14 = newVar(in_stack_00000098,in_stack_00000094,in_stack_000000a0);
    vec<int>::push((vec<int> *)local_8,(int *)(ulong)in_stack_ffffffffffffffd8);
  }
  else {
    puVar2 = (uint *)vec<int>::last((vec<int> *)(in_RDI + 0xa0));
    local_14 = *puVar2;
    vec<int>::pop((vec<int> *)(in_RDI + 0xa0));
    fprintf(_stderr,"reuse %d\n",(ulong)local_14);
    pCVar3 = vec<ChannelInfo>::operator[]((vec<ChannelInfo> *)(in_RDI + 0x30),local_14);
    *pCVar3 = local_8;
    pdVar4 = vec<double>::operator[]((vec<double> *)(in_RDI + 0x1a8),local_14);
    *pdVar4 = 0.0;
    pbVar5 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1e0),local_14);
    *pbVar5 = true;
    LitFlags::LitFlags(&local_18,true,true,true);
    pLVar6 = vec<LitFlags>::operator[]((vec<LitFlags> *)(in_RDI + 0x80),local_14);
    *(undefined1 *)pLVar6 = local_18._0_1_;
  }
  return local_14;
}

Assistant:

int SAT::getLazyVar(ChannelInfo ci) {
	int v;
	if (var_free_list.size() != 0) {
		v = var_free_list.last();
		var_free_list.pop();
		fprintf(stderr, "reuse %d\n", v);
		assert(assigns[v] == toInt(l_Undef));
		assert(watches[2 * v].size() == 0);
		assert(watches[2 * v + 1].size() == 0);
		assert(num_used[v] == 0);
		c_info[v] = ci;
		activity[v] = 0;
		polarity[v] = true;
		flags[v] = LitFlags(true, true, true);
	} else {
		v = newVar(1, ci);
		num_used.push(0);
	}
	//	flags[v].setDecidable(false);
	return v;
}